

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KmerCounter.cc
# Opt level: O0

ostream * operator<<(ostream *os,KmerCounter *kc)

{
  ostream *poVar1;
  ulong uVar2;
  size_type sVar3;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RSI;
  ostream *in_RDI;
  bool bVar4;
  string local_68 [20];
  int in_stack_ffffffffffffffac;
  allocator local_31;
  string local_30 [32];
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_10;
  ostream *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  poVar1 = std::operator<<(in_RDI,"KmerCounter ");
  uVar2 = std::__cxx11::string::empty();
  bVar4 = (uVar2 & 1) != 0;
  if (bVar4) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_30,"unnamed",&local_31);
  }
  else {
    std::__cxx11::string::string(local_30,(string *)(local_10 + 4));
  }
  poVar1 = std::operator<<(poVar1,local_30);
  poVar1 = std::operator<<(poVar1,": index with ");
  sVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_10);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,sVar3);
  poVar1 = std::operator<<(poVar1," ");
  std::__cxx11::to_string(in_stack_ffffffffffffffac);
  poVar1 = std::operator<<(poVar1,local_68);
  std::operator<<(poVar1,"-mers");
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string(local_30);
  if (bVar4) {
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
  }
  return local_8;
}

Assistant:

std::ostream &operator<<(std::ostream &os, const KmerCounter &kc) {
    os << "KmerCounter "<< ( kc.name.empty() ? "unnamed":kc.name ) <<": index with "<<kc.kindex.size()<<" "<<std::to_string(kc.k)<<"-mers";
    return os;
}